

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

void pushbuff(lua_State *L,void *ud)

{
  long lVar1;
  StkId pSVar2;
  TString *pTVar3;
  
  if (*(int *)((long)ud + 0x20) == 2) {
    lVar1 = *(long *)((long)ud + 0x18);
    if ((ulong)(*(long *)((long)ud + 0x10) - lVar1) < 3) {
      *(undefined4 *)(*(long *)((long)ud + 8) + -3 + lVar1) = 0x2e2e2e;
    }
    else {
      *(undefined4 *)(*(long *)((long)ud + 8) + lVar1) = 0x2e2e2e;
      *(long *)((long)ud + 0x18) = *(long *)((long)ud + 0x18) + 3;
    }
  }
  else if (*(int *)((long)ud + 0x20) == 1) {
    luaD_throw(L,'\x04');
  }
  pTVar3 = luaS_newlstr(L,*(char **)((long)ud + 8),*(size_t *)((long)ud + 0x18));
  pSVar2 = (L->top).p;
  *(TString **)pSVar2 = pTVar3;
  (pSVar2->val).tt_ = pTVar3->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return;
}

Assistant:

static void pushbuff (lua_State *L, void *ud) {
  BuffFS *buff = cast(BuffFS*, ud);
  switch (buff->err) {
    case 1:  /* memory error */
      luaD_throw(L, LUA_ERRMEM);
      break;
    case 2:  /* length overflow: Add "..." at the end of result */
      if (buff->buffsize - buff->blen < 3)
        strcpy(buff->b + buff->blen - 3, "...");  /* 'blen' must be > 3 */
      else {  /* there is enough space left for the "..." */
        strcpy(buff->b + buff->blen, "...");
        buff->blen += 3;
      }
      /* FALLTHROUGH */
    default: {  /* no errors, but it can raise one creating the new string */
      TString *ts = luaS_newlstr(L, buff->b, buff->blen);
      setsvalue2s(L, L->top.p, ts);
      L->top.p++;
    }
  }
}